

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O2

ZyanStatus
ZydisInputNextBytes(ZydisDecoderState *state,ZydisDecodedInstruction *instruction,ZyanU8 *value,
                   ZyanU8 number_of_bytes)

{
  ZyanStatus ZVar1;
  uint uVar2;
  ulong __n;
  
  if (value != (ZyanU8 *)0x0) {
    __n = (ulong)number_of_bytes;
    uVar2 = (uint)instruction->length + (uint)number_of_bytes;
    ZVar1 = 0x80200002;
    if ((uVar2 < 0x10) && (ZVar1 = 0x80200000, __n <= state->buffer_len)) {
      instruction->length = (ZyanU8)uVar2;
      memcpy(value,state->buffer,__n);
      state->buffer = state->buffer + __n;
      state->buffer_len = state->buffer_len - __n;
      ZVar1 = 0x100000;
    }
    return ZVar1;
  }
  __assert_fail("value",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                ,0x156,
                "ZyanStatus ZydisInputNextBytes(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8 *, ZyanU8)"
               );
}

Assistant:

static ZyanStatus ZydisInputNextBytes(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction, ZyanU8* value, ZyanU8 number_of_bytes)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(value);

    if (instruction->length + number_of_bytes > ZYDIS_MAX_INSTRUCTION_LENGTH)
    {
        return ZYDIS_STATUS_INSTRUCTION_TOO_LONG;
    }

    if (state->buffer_len >= number_of_bytes)
    {
        instruction->length += number_of_bytes;

        ZYAN_MEMCPY(value, state->buffer, number_of_bytes);
        state->buffer += number_of_bytes;
        state->buffer_len -= number_of_bytes;

        return ZYAN_STATUS_SUCCESS;
    }

    return ZYDIS_STATUS_NO_MORE_DATA;
}